

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cpp
# Opt level: O3

void __thiscall Hash_VarArgs_Test::TestBody(Hash_VarArgs_Test *this)

{
  bool bVar1;
  ulong uVar2;
  char *message;
  long lVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  lVar3 = 0;
  do {
    uVar2 = ((ulong)*(uint *)((long)&DAT_00608840 + lVar3) ^ 0x1a929e4d6f47a654) *
            -0x395b586ca42e166b;
    uVar2 = (uVar2 >> 0x2f ^ uVar2) * -0x395b586ca42e166b;
    local_50.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (uVar2 >> 0x2f ^ uVar2);
    local_48.data_ = (AssertHelperData *)local_50.ptr_;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_40,"HashBuffer(buf + i, sizeof(int))","Hash(buf[i])",(unsigned_long *)&local_50
               ,(unsigned_long *)&local_48);
    if (local_40[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      message = "";
      if (local_38.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = ((local_38.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/hash_test.cpp"
                 ,0x10,message);
      testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_48);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

TEST(Hash, VarArgs) {
    int buf[] = {1, -12511, 31415821, 37};
    for (int i = 0; i < 4; ++i)
        EXPECT_EQ(HashBuffer(buf + i, sizeof(int)), Hash(buf[i]));
}